

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O3

size_t __thiscall
cali::CompressedSnapshotRecord::append(CompressedSnapshotRecord *this,size_t n,Node **node_vec)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  size_t __n;
  size_t __n_00;
  size_t i;
  ulong uVar8;
  long lVar9;
  uchar *puVar10;
  ulong uVar11;
  uchar tmp [40];
  byte local_58 [40];
  
  if (n == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      uVar11 = 4;
      if (n < 4) {
        uVar11 = n;
      }
      uVar8 = 0;
      __n_00 = 0;
      do {
        uVar6 = node_vec[uVar8]->m_id;
        pbVar7 = local_58 + __n_00;
        lVar9 = 1;
        if (0x7f < uVar6) {
          uVar5 = uVar6;
          lVar3 = 0;
          do {
            lVar9 = lVar3;
            pbVar7[lVar9] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            bVar2 = 0x3fff < uVar5;
            uVar5 = uVar6;
            lVar3 = lVar9 + 1;
          } while (bVar2);
          pbVar7 = pbVar7 + lVar9 + 1;
          lVar9 = lVar9 + 2;
        }
        *pbVar7 = (byte)uVar6;
        __n_00 = __n_00 + lVar9;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar11);
      if (this->m_num_nodes + uVar11 < 0x80) {
        sVar1 = this->m_imm_pos;
        uVar8 = this->m_imm_len;
        if (this->m_buffer_len < sVar1 + __n_00 + uVar8) goto LAB_001873c1;
        puVar10 = this->m_buffer;
        if (uVar8 != 0 && __n_00 != 0) {
          do {
            __n = 0x40;
            if (uVar8 < 0x40) {
              __n = uVar8;
            }
            uVar8 = uVar8 - __n;
            memmove(puVar10 + uVar8 + __n_00 + sVar1,puVar10 + uVar8 + sVar1,__n);
          } while (uVar8 != 0);
          puVar10 = this->m_buffer;
        }
        memcpy(puVar10 + 1,local_58,__n_00);
        this->m_imm_pos = this->m_imm_pos + __n_00;
        this->m_num_nodes = this->m_num_nodes + uVar11;
        *this->m_buffer = *this->m_buffer + (char)uVar11;
      }
      else {
LAB_001873c1:
        sVar4 = sVar4 + uVar11;
      }
      this->m_needed_len = this->m_needed_len + __n_00;
      node_vec = node_vec + uVar11;
      n = n - uVar11;
    } while (n != 0);
  }
  this->m_skipped = this->m_skipped + sVar4;
  return sVar4;
}

Assistant:

size_t CompressedSnapshotRecord::append(size_t n, const Node* const node_vec[])
{
    size_t skipped = 0;

    // blockwise encode, size check, and copy
    while (n > 0) {
        unsigned char tmp[m_blocksize * 10];
        size_t        blk = std::min(n, m_blocksize);
        size_t        len = 0;

        // encode to temp buffer
        for (size_t i = 0; i < blk; ++i)
            len += vlenc_u64(node_vec[i]->id(), tmp + len);

        // size check, copy to actual buffer
        if (m_num_nodes + blk < 128 && m_imm_pos + m_imm_len + len <= m_buffer_len) {
            ::save_memmove(m_buffer + m_imm_pos + len, m_buffer + m_imm_pos, m_imm_len);
            memcpy(m_buffer + 1, tmp, len);

            m_imm_pos += len;
            m_num_nodes += blk;
            m_buffer[0] += blk;
        } else {
            skipped += blk;
        }

        m_needed_len += len;

        // advance
        node_vec += blk;
        n -= blk;
    }

    m_skipped += skipped;

    return skipped;
}